

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroupDictionary.h
# Opt level: O0

SamReadGroupDictionary * __thiscall
BamTools::SamReadGroupDictionary::operator=
          (SamReadGroupDictionary *this,SamReadGroupDictionary *param_2)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDI;
  vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_> *in_stack_00000088;
  vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_> *in_stack_00000090;
  
  std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=(in_RSI,in_RDI);
  return (SamReadGroupDictionary *)in_RDI;
}

Assistant:

class API_EXPORT SamReadGroupDictionary {

    // ctor & dtor
    public:
        SamReadGroupDictionary(void);
        SamReadGroupDictionary(const SamReadGroupDictionary& other);
        ~SamReadGroupDictionary(void);

    // query/modify read group data
    public:
        // adds a read group
        void Add(const SamReadGroup& readGroup);
        void Add(const std::string& readGroupId);

        // adds multiple read groups
        void Add(const SamReadGroupDictionary& readGroups);
        void Add(const std::vector<SamReadGroup>& readGroups);
        void Add(const std::vector<std::string>& readGroupIds);

        // clears all read group entries
        void Clear(void);

        // returns true if dictionary contains this read group
        bool Contains(const SamReadGroup& readGroup) const;
        bool Contains(const std::string& readGroupId) const;

        // returns true if dictionary is empty
        bool IsEmpty(void) const;

        // removes read group, if found
        void Remove(const SamReadGroup& readGroup);
        void Remove(const std::string& readGroupId);

        // removes multiple read groups
        void Remove(const std::vector<SamReadGroup>& readGroups);
        void Remove(const std::vector<std::string>& readGroupIds);

        // returns number of read groups in dictionary
        int Size(void) const;

        // retrieves a modifiable reference to the SamReadGroup object associated with this ID
        SamReadGroup& operator[](const std::string& readGroupId);

    // retrieve STL-compatible iterators
    public:
        SamReadGroupIterator      Begin(void);              // returns iterator to begin()
        SamReadGroupConstIterator Begin(void) const;        // returns const_iterator to begin()
        SamReadGroupConstIterator ConstBegin(void) const;   // returns const_iterator to begin()
        SamReadGroupIterator      End(void);                // returns iterator to end()
        SamReadGroupConstIterator End(void) const;          // returns const_iterator to end()
        SamReadGroupConstIterator ConstEnd(void) const;     // returns const_iterator to end()

    // data members
    private:
        SamReadGroupContainer m_data;
        std::map<std::string, size_t> m_lookupData;
}